

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteSubtype(Unsubtyping *this,Type sub,Type super)

{
  Type sub_00;
  size_t sVar1;
  size_t sVar2;
  Type *pTVar3;
  HeapType sub_01;
  HeapType super_00;
  Iterator local_50;
  Type local_40;
  Type super_local;
  Type sub_local;
  
  local_40.id = super.id;
  super_local = sub;
  if ((sub.id & 1) == 0 || sub.id < 7) {
    if (((sub.id & 1) == 0 && 6 < sub.id) && ((super.id & 1) == 0 && 6 < super.id)) {
      sub_01 = wasm::Type::getHeapType(&super_local);
      super_00 = wasm::Type::getHeapType(&local_40);
      noteSubtype(this,sub_01,super_00);
    }
    return;
  }
  if ((6 < super.id) && ((super.id & 1) != 0)) {
    sVar1 = wasm::Type::size(&super_local);
    sVar2 = wasm::Type::size(&local_40);
    if (sVar1 == sVar2) {
      sVar1 = wasm::Type::size(&super_local);
      if (sVar1 == 0) {
        return;
      }
      sVar2 = 0;
      do {
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &super_local;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar2;
        pTVar3 = wasm::Type::Iterator::operator*(&local_50);
        sub_00.id = pTVar3->id;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_40;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar2;
        pTVar3 = wasm::Type::Iterator::operator*(&local_50);
        noteSubtype(this,sub_00,(Type)pTVar3->id);
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
      return;
    }
  }
  __assert_fail("super.isTuple() && sub.size() == super.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                ,0xad,"void wasm::(anonymous namespace)::Unsubtyping::noteSubtype(Type, Type)");
}

Assistant:

void noteSubtype(Type sub, Type super) {
    if (sub.isTuple()) {
      assert(super.isTuple() && sub.size() == super.size());
      for (size_t i = 0, size = sub.size(); i < size; ++i) {
        noteSubtype(sub[i], super[i]);
      }
      return;
    }
    if (!sub.isRef() || !super.isRef()) {
      return;
    }
    noteSubtype(sub.getHeapType(), super.getHeapType());
  }